

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableSetColumnWidthAutoAll(ImGuiTable *table)

{
  ImGuiTableColumn *pIVar1;
  long lVar2;
  long lVar3;
  
  if (0 < table->ColumnsCount) {
    lVar2 = 100;
    lVar3 = 0;
    do {
      pIVar1 = (table->Columns).Data;
      if ((*(char *)((long)pIVar1 + lVar2 + -10) != '\0') ||
         ((*(byte *)((long)pIVar1 + lVar2 + -100) & 8) != 0)) {
        *(undefined2 *)((long)pIVar1 + lVar2 + -1) = 0x102;
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x68;
    } while (lVar3 < table->ColumnsCount);
  }
  return;
}

Assistant:

void ImGui::TableSetColumnWidthAutoAll(ImGuiTable* table)
{
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled && !(column->Flags & ImGuiTableColumnFlags_WidthStretch)) // Cannot reset weight of hidden stretch column
            continue;
        column->CannotSkipItemsQueue = (1 << 0);
        column->AutoFitQueue = (1 << 1);
    }
}